

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

_Bool hdr_record_values_atomic(hdr_histogram *h,int64_t value,int64_t count)

{
  long lVar1;
  int32_t iVar2;
  _Bool _Var3;
  bool bVar4;
  
  if (value < 0) {
    _Var3 = false;
  }
  else if (((h->highest_trackable_value < value) || (iVar2 = counts_index_for(h,value), iVar2 < 0))
          || (h->counts_len <= iVar2)) {
    _Var3 = false;
  }
  else {
    iVar2 = normalize_index(h,iVar2);
    LOCK();
    h->counts[iVar2] = h->counts[iVar2] + count;
    UNLOCK();
    LOCK();
    h->total_count = h->total_count + count;
    UNLOCK();
    do {
      lVar1 = h->min_value;
      if ((value == 0) || (lVar1 <= value)) break;
      LOCK();
      bVar4 = lVar1 == h->min_value;
      if (bVar4) {
        h->min_value = value;
      }
      UNLOCK();
    } while (!bVar4);
    do {
      lVar1 = h->max_value;
      _Var3 = true;
      if (value <= lVar1) {
        return true;
      }
      LOCK();
      bVar4 = lVar1 == h->max_value;
      if (bVar4) {
        h->max_value = value;
      }
      UNLOCK();
    } while (!bVar4);
  }
  return _Var3;
}

Assistant:

bool hdr_record_values_atomic(struct hdr_histogram* h, int64_t value, int64_t count)
{
    int32_t counts_index;

    if (value < 0 || h->highest_trackable_value < value)
    {
        return false;
    }

    counts_index = counts_index_for(h, value);

    if (counts_index < 0 || h->counts_len <= counts_index)
    {
        return false;
    }

    counts_inc_normalised_atomic(h, counts_index, count);
    update_min_max_atomic(h, value);

    return true;
}